

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::isCoreTester
               (ContextType *contextType,TesterType tester)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  
  bVar1 = (byte)tester;
  bVar2 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  if (bVar2) {
    bVar3 = 1;
    if ((tester == TESTER_DEPTH_STENCIL_TEXTURE_MODE) ||
       ((tester < TESTER_DEPTH_STENCIL_TEXTURE_MODE & (byte)(0x649249249249 >> (bVar1 & 0x3f))) != 0
       )) goto LAB_007e363d;
    if (TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER < tester) {
LAB_007e363b:
      bVar3 = 0;
      goto LAB_007e363d;
    }
    uVar4 = 0x1e31b6db6db6db6;
  }
  else {
    bVar2 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
    if (bVar2) {
      bVar3 = (byte)(0x649249249249 >> (bVar1 & 0x3f)) & tester < TESTER_DEPTH_STENCIL_TEXTURE_MODE
              | tester == TESTER_DEPTH_STENCIL_TEXTURE_MODE;
      goto LAB_007e363d;
    }
    bVar2 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
    if (!bVar2 || TESTER_TEXTURE_IMMUTABLE_FORMAT < tester) goto LAB_007e363b;
    uVar4 = 0x649249249249;
  }
  bVar3 = (byte)(uVar4 >> (bVar1 & 0x3f));
LAB_007e363d:
  return (bool)(bVar3 & 1);
}

Assistant:

static bool isCoreTester (const glu::ContextType& contextType, TesterType tester)
{
	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::isCoreTester(tester);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::isCoreTester(tester);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::isCoreTester(tester);
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}